

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

void __thiscall phosg::Image::set_channel_width(Image *this,uint8_t new_width)

{
  uint8_t uVar1;
  bool bVar2;
  ushort uVar3;
  uint uVar4;
  undefined8 uVar5;
  byte bVar6;
  void *pvVar7;
  runtime_error *this_00;
  long lVar8;
  long lVar9;
  ulong uVar10;
  void *__ptr;
  undefined1 uVar11;
  undefined2 uVar12;
  ulong uVar13;
  
  bVar6 = new_width * ' ' | (byte)(new_width - 8) >> 3;
  if ((7 < bVar6) || ((0x8bU >> (bVar6 & 0x1f) & 1) == 0)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(this_00,"channel width must be 8, 16, 32, or 64");
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar1 = this->channel_width;
  if (uVar1 != new_width) {
    lVar9 = this->height * this->width;
    bVar2 = this->has_alpha;
    pvVar7 = malloc((ulong)(new_width >> 3) * ((ulong)bVar2 + 3) * lVar9);
    if (lVar9 == 0) {
      __ptr = (this->data).raw;
    }
    else {
      lVar9 = ((ulong)bVar2 + 3) * lVar9;
      __ptr = (this->data).raw;
      lVar8 = 0;
      do {
        switch(uVar1 << 5 | (byte)(uVar1 - 8) >> 3) {
        case 0:
          bVar6 = *(byte *)((long)__ptr + lVar8);
          uVar10 = (ulong)bVar6;
          if (new_width == '@') {
            uVar13 = (ulong)bVar6 << 8 |
                     (ulong)bVar6 << 0x10 |
                     (ulong)bVar6 << 0x18 |
                     uVar10 << 0x20 | uVar10 << 0x28 | uVar10 << 0x30 | uVar10 << 0x38;
LAB_001092f8:
            *(ulong *)((long)pvVar7 + lVar8 * 8) = uVar13 | uVar10;
          }
          else if (new_width == ' ') {
            *(uint *)((long)pvVar7 + lVar8 * 4) =
                 (uint)bVar6 << 8 | (uint)bVar6 << 0x10 | (uint)bVar6 << 0x18 | (uint)bVar6;
          }
          else if (new_width == '\x10') {
            *(ushort *)((long)pvVar7 + lVar8 * 2) = CONCAT11(bVar6,bVar6);
          }
          break;
        case 1:
          uVar3 = *(ushort *)((long)__ptr + lVar8 * 2);
          uVar10 = (ulong)uVar3;
          if (new_width == '@') {
            *(ulong *)((long)pvVar7 + lVar8 * 8) =
                 (ulong)uVar3 << 0x10 | uVar10 << 0x20 | uVar10 << 0x30 | uVar10;
          }
          else if (new_width == ' ') {
            *(uint *)((long)pvVar7 + lVar8 * 4) = CONCAT22(uVar3,uVar3);
          }
          else if (new_width == '\b') {
            *(char *)((long)pvVar7 + lVar8) = (char)(uVar3 >> 8);
          }
          break;
        case 3:
          uVar4 = *(uint *)((long)__ptr + lVar8 * 4);
          uVar10 = (ulong)uVar4;
          if (new_width == '@') {
            uVar13 = uVar10 << 0x20;
            goto LAB_001092f8;
          }
          if (new_width == '\x10') {
            uVar12 = (undefined2)(uVar4 >> 0x10);
LAB_0010932b:
            *(undefined2 *)((long)pvVar7 + lVar8 * 2) = uVar12;
          }
          else if (new_width == '\b') {
            uVar11 = (undefined1)(uVar4 >> 0x18);
LAB_0010925d:
            *(undefined1 *)((long)pvVar7 + lVar8) = uVar11;
          }
          break;
        case 7:
          uVar5 = *(undefined8 *)((long)__ptr + lVar8 * 8);
          if (new_width == ' ') {
            *(int *)((long)pvVar7 + lVar8 * 4) = (int)((ulong)uVar5 >> 0x20);
          }
          else {
            if (new_width == '\x10') {
              uVar12 = (undefined2)((ulong)uVar5 >> 0x30);
              goto LAB_0010932b;
            }
            if (new_width == '\b') {
              uVar11 = (undefined1)((ulong)uVar5 >> 0x38);
              goto LAB_0010925d;
            }
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar9 + (ulong)(lVar9 == 0) != lVar8);
    }
    free(__ptr);
    (this->data).raw = pvVar7;
    this->channel_width = new_width;
    this->max_value = 0xffffffffffffffff >> (-new_width & 0x3f);
  }
  return;
}

Assistant:

void Image::set_channel_width(uint8_t new_width) {
  if (new_width != 8 && new_width != 16 && new_width != 32 && new_width != 64) {
    throw runtime_error("channel width must be 8, 16, 32, or 64");
  }
  if (this->channel_width == new_width) {
    return;
  }

  DataPtrs new_data;
  new_data.raw = malloc(this->width * this->height * (3 + this->has_alpha) * (new_width / 8));

  size_t value_count = this->width * this->height * (this->has_alpha ? 4 : 3);
  for (size_t z = 0; z < value_count; z++) {
    uint64_t v;
    // If the new channel width is larger than the current width, expand the
    // channels by copying the now-high bits to the lower bits. If the new
    // channel width is smaller, preserve only the high bits of the original
    // values.
    if (this->channel_width == 8) {
      v = this->data.as8[z];
      if (new_width == 16) {
        new_data.as16[z] = (v << 8) | v;
      } else if (new_width == 32) {
        new_data.as32[z] = (v << 24) | (v << 16) | (v << 8) | v;
      } else if (new_width == 64) {
        new_data.as64[z] = (v << 56) | (v << 48) | (v << 40) | (v << 32) | (v << 24) | (v << 16) | (v << 8) | v;
      }

    } else if (this->channel_width == 16) {
      v = this->data.as16[z];
      if (new_width == 8) {
        new_data.as8[z] = v >> 8;
      } else if (new_width == 32) {
        new_data.as32[z] = (v << 16) | v;
      } else if (new_width == 64) {
        new_data.as64[z] = (v << 48) | (v << 32) | (v << 16) | v;
      }

    } else if (this->channel_width == 32) {
      v = this->data.as32[z];
      if (new_width == 8) {
        new_data.as8[z] = v >> 24;
      } else if (new_width == 16) {
        new_data.as16[z] = v >> 16;
      } else if (new_width == 64) {
        new_data.as64[z] = (v << 32) | v;
      }

    } else if (this->channel_width == 64) {
      v = this->data.as64[z];
      if (new_width == 8) {
        new_data.as8[z] = v >> 56;
      } else if (new_width == 16) {
        new_data.as16[z] = v >> 48;
      } else if (new_width == 32) {
        new_data.as32[z] = v >> 32;
      }
    }
  }

  free(this->data.raw);
  this->data.raw = new_data.raw;
  this->channel_width = new_width;
  this->max_value = mask_for_width(this->channel_width);
}